

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
::_reduce(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
          *this)

{
  pointer pIVar1;
  long lVar2;
  Index i;
  Pos_index target;
  ulong uVar3;
  long lVar4;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&(this->super_RU_pairing_option).indexToBar_,
             (ulong)(this->reducedMatrixR_).nextInsertIndex_);
  lVar4 = 0x28;
  for (uVar3 = 0; uVar3 < (this->reducedMatrixR_).nextInsertIndex_; uVar3 = uVar3 + 1) {
    pIVar1 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&(pIVar1->super_Row_access_option).columnIndex_ + lVar4);
    target = (Pos_index)uVar3;
    if ((long)&(pIVar1->super_Row_access_option).columnIndex_ + lVar4 == lVar2 || lVar2 == 0) {
      RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
      ::_add_bar(&this->super_RU_pairing_option,*(Dimension *)((long)pIVar1 + lVar4 + -0x18),target)
      ;
    }
    else {
      _reduce_column(this,target,target);
    }
    lVar4 = lVar4 + 0x38;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce()
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(reducedMatrixR_.get_number_of_columns());
  }

  for (Index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if (!(reducedMatrixR_.is_zero_column(i))) {
      _reduce_column(i, i);
    } else {
      _add_bar(get_column_dimension(i), i);
    }
  }
}